

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  pointer puVar1;
  __uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
  _Var2;
  __uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
  _Var3;
  long lVar4;
  long lVar5;
  allocator_type local_3a;
  allocator_type local_39;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
  *local_38;
  
  this->descriptor_ = descriptor;
  local_38 = &this->field_generators_;
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
  ::vector(local_38,(long)*(int *)(descriptor + 4),&local_39);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
  ::vector(&this->extension_generators_,(long)*(int *)(descriptor + 0x7c),&local_3a);
  if (0 < *(int *)(descriptor + 4)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      puVar1 = (local_38->
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>.
      _M_head_impl = (tuple<google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                      )FieldGenerator::Make
                                 ((FieldDescriptor *)(*(long *)(descriptor + 0x28) + lVar5),options)
      ;
      _Var2._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>.
      _M_head_impl = puVar1[lVar4]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                     ._M_t;
      puVar1[lVar4]._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
      ._M_t = _Var3._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
              .
              super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
              ._M_head_impl;
      if ((_Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
           )_Var2._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
            .super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>.
            _M_head_impl != (FieldGenerator *)0x0) {
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
                              ._M_head_impl + 8))();
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x48;
    } while (lVar4 < *(int *)(descriptor + 4));
  }
  if (0 < *(int *)(descriptor + 0x7c)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      puVar1 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>.
      _M_head_impl = (tuple<google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                      )FieldGenerator::Make
                                 ((FieldDescriptor *)(*(long *)(descriptor + 0x50) + lVar5),options)
      ;
      _Var2._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>.
      _M_head_impl = puVar1[lVar4]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                     ._M_t;
      puVar1[lVar4]._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
      ._M_t = _Var3._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
              .
              super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
              ._M_head_impl;
      if ((_Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
           )_Var2._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
            .super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>.
            _M_head_impl != (FieldGenerator *)0x0) {
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
                              ._M_head_impl + 8))();
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x48;
    } while (lVar4 < *(int *)(descriptor + 0x7c));
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      field_generators_(descriptor->field_count()),
      extension_generators_(descriptor->extension_count()) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(
        FieldGenerator::Make(descriptor->field(i), options));
  }
  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
        FieldGenerator::Make(descriptor->extension(i), options));
  }
}